

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

Status __thiscall
google::protobuf::json_internal::anon_unknown_5::
ParseDuration<google::protobuf::json_internal::ParseProto2Descriptor>
          (anon_unknown_5 *this,JsonLexer *lex,
          Desc<google::protobuf::json_internal::ParseProto2Descriptor> *desc,
          Msg<google::protobuf::json_internal::ParseProto2Descriptor> *msg)

{
  size_t x;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  aVar1;
  char cVar2;
  int iVar3;
  _Optional_payload_base<int> _Var4;
  Field pFVar5;
  _Optional_payload_base<int> _Var6;
  long lVar7;
  char *pcVar8;
  undefined8 uVar9;
  bool bVar10;
  string_view sVar11;
  string_view sVar12;
  string_view rest;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  str;
  string_view local_98;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  local_88;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
  local_80;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
  local_50;
  
  JsonLexer::PeekKind((JsonLexer *)&local_88.status_);
  aVar1 = local_88;
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
            ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)&local_88.status_);
  if ((aVar1 == (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                 )0x1) && (local_80._0_4_ == 6)) {
    JsonLexer::Expect((JsonLexer *)this,lex,4,"null");
    return (Status)(uintptr_t)this;
  }
  JsonLexer::ParseUtf8
            ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              *)&local_88.status_,lex);
  *(anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
    *)this = local_88;
  if (((ulong)local_88 & 1) == 0) {
    LOCK();
    *(int *)local_88 = *(int *)local_88 + 1;
    UNLOCK();
  }
  if (*(long *)this != 1) goto LAB_002c77f7;
  if (local_88 ==
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
       )0x1) {
    sVar11 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_80._M_first);
    if (sVar11._M_len == 0) {
      lex._0_4_ = (_Storage<int,_true>)0x0;
      lex._4_1_ = false;
      lex._5_3_ = 0;
    }
    else {
      lex._0_4_ = (_Storage<int,_true>)0x0;
      lex._4_1_ = false;
      lex._5_3_ = 0;
      lVar7 = 0;
      do {
        cVar2 = sVar11._M_str[lVar7];
        bVar10 = (byte)(cVar2 - 0x30U) < 10;
        lex = (JsonLexer *)((long)lex + (ulong)(cVar2 == '-' || bVar10));
        if (cVar2 != '-' && !bVar10) break;
        bVar10 = sVar11._M_len - 1 != lVar7;
        lVar7 = lVar7 + 1;
      } while (bVar10);
    }
    if ((_Optional_payload_base<int>)lex == (_Optional_payload_base<int>)0x0) {
      if (local_88 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        JsonLocation::Invalid
                  ((JsonLocation *)this,&local_50,0x23,"duration must start with an integer");
        goto LAB_002c77f7;
      }
      goto LAB_002c793f;
    }
    if (local_88 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) goto LAB_002c792b;
    sVar11 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_80._M_first);
    _Var4 = (_Optional_payload_base<int>)sVar11._M_len;
    _Var6 = (_Optional_payload_base<int>)lex;
    if ((ulong)_Var4 < lex) {
      _Var6 = _Var4;
    }
    cVar2 = absl::lts_20240722::numbers_internal::safe_strto64_base
                      (_Var6,sVar11._M_str,&local_98,10);
    x = local_98._M_len;
    if (cVar2 == '\0') {
      if (local_88 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        pcVar8 = "duration had bad seconds";
        uVar9 = 0x18;
        goto LAB_002c77ea;
      }
      goto LAB_002c7935;
    }
    if (local_98._M_len - 0x4979cb9e01 < 0xffffff6d0c68c3ff) {
      if (local_88 !=
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) goto LAB_002c7935;
      pcVar8 = "duration out of range";
      uVar9 = 0x15;
LAB_002c77ea:
      JsonLocation::Invalid((JsonLocation *)this,&local_50,uVar9,pcVar8);
LAB_002c77f7:
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)&local_88.status_);
      return (Status)(uintptr_t)this;
    }
    if (local_88 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) goto LAB_002c7949;
    sVar12 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_80._M_first);
    _Var6 = (_Optional_payload_base<int>)sVar12._M_len;
    if ((ulong)_Var6 < lex) goto LAB_002c7967;
    local_98._M_len = (long)_Var6 - (long)lex;
    local_98._M_str = sVar12._M_str + (long)lex;
    lex = (JsonLexer *)TakeNanosAndAdvance(&local_98);
    if (((ulong)lex >> 0x20 & 1) == 0) {
      if (local_88 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        JsonLocation::Invalid((JsonLocation *)this,&local_50,0x1c,"duration had bad nanoseconds");
        goto LAB_002c77f7;
      }
      goto LAB_002c7953;
    }
    if (((long)x < 0) || ((_Var4 != (_Optional_payload_base<int>)0x0 && (*sVar11._M_str == '-')))) {
      lex._0_4_ = -(int)lex;
      lex._4_4_ = 0;
    }
    if ((local_98._M_len == 1) && (iVar3 = bcmp(local_98._M_str,"s",1), iVar3 == 0)) {
      pFVar5 = Proto2Descriptor::MustHaveField(desc,1);
      ParseProto2Descriptor::SetInt64(pFVar5,msg,x);
      pFVar5 = Proto2Descriptor::MustHaveField(desc,2);
      ParseProto2Descriptor::SetInt32(pFVar5,msg,(int)lex);
      *(undefined8 *)this = 1;
      goto LAB_002c77f7;
    }
    if (local_88 ==
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) {
      JsonLocation::Invalid
                ((JsonLocation *)this,&local_50,0x23,"duration must end with a single \'s\'");
      goto LAB_002c77f7;
    }
  }
  else {
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_88.status_);
LAB_002c792b:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_88.status_);
LAB_002c7935:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_88.status_);
LAB_002c793f:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_88.status_);
LAB_002c7949:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_88.status_);
LAB_002c7953:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_88.status_);
  }
  _Var6 = (_Optional_payload_base<int>)
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_88.status_);
LAB_002c7967:
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",lex,
             _Var6);
}

Assistant:

absl::Status ParseDuration(JsonLexer& lex, const Desc<Traits>& desc,
                           Msg<Traits>& msg) {
  if (lex.Peek(JsonLexer::kNull)) {
    return lex.Expect("null");
  }

  constexpr int64_t kMaxSeconds = int64_t{3652500} * 86400;

  absl::StatusOr<LocationWith<MaybeOwnedString>> str = lex.ParseUtf8();
  RETURN_IF_ERROR(str.status());

  size_t int_part_end = 0;
  for (char c : str->value.AsView()) {
    if (!absl::ascii_isdigit(c) && c != '-') {
      break;
    }
    ++int_part_end;
  }
  if (int_part_end == 0) {
    return str->loc.Invalid("duration must start with an integer");
  }

  absl::string_view sec_digits = str->value.AsView().substr(0, int_part_end);
  int64_t secs;
  if (!absl::SimpleAtoi(sec_digits, &secs)) {
    return str->loc.Invalid("duration had bad seconds");
  }

  if (secs > kMaxSeconds || secs < -kMaxSeconds) {
    return str->loc.Invalid("duration out of range");
  }

  absl::string_view rest = str->value.AsView().substr(int_part_end);
  auto nanos = TakeNanosAndAdvance(rest);
  if (!nanos.has_value()) {
    return str->loc.Invalid("duration had bad nanoseconds");
  }

  bool isNegative = (secs < 0) || absl::StartsWith(sec_digits, "-");
  if (isNegative) {
    *nanos *= -1;
  }

  if (rest != "s") {
    return str->loc.Invalid("duration must end with a single 's'");
  }

  Traits::SetInt64(Traits::MustHaveField(desc, 1), msg, secs);
  Traits::SetInt32(Traits::MustHaveField(desc, 2), msg, *nanos);

  return absl::OkStatus();
}